

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configset.hh
# Opt level: O0

int __thiscall utilmm::config_set::get<int>(config_set *this,string *name,int *defval,type *enabler)

{
  int iVar1;
  reference pvVar2;
  list<int,_std::allocator<int>_> local_68;
  undefined1 local_40 [8];
  list<int,_std::allocator<int>_> deflist;
  type *enabler_local;
  int *defval_local;
  string *name_local;
  config_set *this_local;
  
  deflist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = (size_t)enabler;
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)local_40);
  std::__cxx11::list<int,_std::allocator<int>_>::push_back
            ((list<int,_std::allocator<int>_> *)local_40,defval);
  get<std::__cxx11::list<int,std::allocator<int>>>
            (&local_68,this,name,(list<int,_std::allocator<int>_> *)local_40,(type *)0x0);
  pvVar2 = std::__cxx11::list<int,_std::allocator<int>_>::front(&local_68);
  iVar1 = *pvVar2;
  std::__cxx11::list<int,_std::allocator<int>_>::~list(&local_68);
  std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)local_40);
  return iVar1;
}

Assistant:

T config_set::get(std::string const& name, T const& defval,
            typename boost::disable_if< details::is_list<T> >::type *enabler) const
    {
        std::list<T> deflist;
        deflist.push_back(defval);
        return get< std::list<T> >(name, deflist).front();
    }